

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoQuad>::Print
          (TPZGeoElRefPattern<pzgeom::TPZGeoQuad> *this,ostream *out)

{
  bool bVar1;
  TPZGeoElRefLess<pzgeom::TPZGeoQuad> *in_RSI;
  ostream *in_RDI;
  ostream *in_stack_000000b8;
  TPZRefPattern *in_stack_000000c0;
  
  TPZGeoElRefLess<pzgeom::TPZGeoQuad>::Print(in_RSI,in_RDI);
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x160));
  if (bVar1) {
    TPZAutoPointer<TPZRefPattern>::operator->((TPZAutoPointer<TPZRefPattern> *)(in_RDI + 0x160));
    TPZRefPattern::ShortPrint(in_stack_000000c0,in_stack_000000b8);
    std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Print(std::ostream & out)
{
	TPZGeoElRefLess<TGeo>::Print(out);
	
	if(fRefPattern)
	{
		fRefPattern->ShortPrint(out);
		out << std::endl;
	}
}